

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

void add_pax_attr_int(archive_string *as,char *key,int64_t value)

{
  char *value_00;
  char tmp [25];
  int64_t value_local;
  char *key_local;
  archive_string *as_local;
  
  tmp[0x10] = '\0';
  value_00 = format_int(tmp + 0x10,value);
  add_pax_attr(as,key,value_00);
  return;
}

Assistant:

static void
add_pax_attr_int(struct archive_string *as, const char *key, int64_t value)
{
	char tmp[1 + 3 * sizeof(value)];

	tmp[sizeof(tmp) - 1] = 0;
	add_pax_attr(as, key, format_int(tmp + sizeof(tmp) - 1, value));
}